

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void __thiscall
SimpleLogger::SimpleLogger
          (SimpleLogger *this,string *file_path,size_t max_log_elems,uint64_t log_file_size_limit,
          uint32_t max_log_files)

{
  int iVar1;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"//","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/","");
  replaceString(&this->filePath,file_path,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->maxLogFiles).super___atomic_base<unsigned_long>._M_i = (ulong)max_log_files;
  std::ofstream::ofstream(&this->fs);
  this->maxLogFileSize = log_file_size_limit;
  this->numCompJobs = (__atomic_base<unsigned_int>)0x0;
  this->curLogLevel = (__atomic_base<int>)0x4;
  (this->curDispLevel).super___atomic_base<int>._M_i = 4;
  (this->displayLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->displayLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->displayLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->displayLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->displayLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  iVar1 = SimpleLoggerMgr::getTzGap();
  this->tzGap = iVar1;
  (this->cursor).super___atomic_base<unsigned_long>._M_i = 0;
  std::vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>::vector
            (&this->logs,max_log_elems,(allocator_type *)&local_70);
  *(undefined8 *)((long)&(this->flushingLogs).super___mutex_base._M_mutex + 0x10) = 0;
  (this->flushingLogs).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->flushingLogs).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->flushingLogs).super___mutex_base._M_mutex + 8) = 0;
  (this->flushingLogs).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  findMinMaxRevNum(this,&this->minRevnum,&this->curRevnum);
  return;
}

Assistant:

SimpleLogger::SimpleLogger(const std::string& file_path,
                           size_t max_log_elems,
                           uint64_t log_file_size_limit,
                           uint32_t max_log_files)
    : filePath(replaceString(file_path, "//", "/"))
    , maxLogFiles(max_log_files)
    , maxLogFileSize(log_file_size_limit)
    , numCompJobs(0)
    , curLogLevel(4)
    , curDispLevel(4)
    , tzGap( SimpleLoggerMgr::getTzGap() )
    , cursor(0)
    , logs(max_log_elems)
{
    findMinMaxRevNum(minRevnum, curRevnum);
}